

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncGenerator.h
# Opt level: O0

void __thiscall
Js::JavascriptAsyncGenerator::JavascriptAsyncGenerator
          (JavascriptAsyncGenerator *this,DynamicType *type,Arguments *args,
          ScriptFunction *scriptFunction,RequestQueue *requestQueue)

{
  RequestQueue *requestQueue_local;
  ScriptFunction *scriptFunction_local;
  Arguments *args_local;
  DynamicType *type_local;
  JavascriptAsyncGenerator *this_local;
  
  JavascriptGenerator::JavascriptGenerator
            (&this->super_JavascriptGenerator,type,args,scriptFunction);
  (this->super_JavascriptGenerator).super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01db73d0;
  Memory::
  WriteBarrierPtr<DList<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_Memory::Recycler,_RealCount>_>
  ::WriteBarrierPtr(&this->requestQueue,requestQueue);
  this->pendingState = None;
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr(&this->onFulfilled);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr(&this->onRejected);
  return;
}

Assistant:

JavascriptAsyncGenerator(
        DynamicType* type,
        Arguments& args,
        ScriptFunction* scriptFunction,
        RequestQueue* requestQueue) :
            JavascriptGenerator(type, args, scriptFunction),
            requestQueue(requestQueue) {}